

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utf.cpp
# Opt level: O0

void __thiscall Utf16ToUtf8_All_Test::Utf16ToUtf8_All_Test(Utf16ToUtf8_All_Test *this)

{
  Utf16ToUtf8_All_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Utf16ToUtf8_All_Test_00322c18;
  return;
}

Assistant:

TEST (Utf16ToUtf8, All) {
    using namespace pstore::utf;

    EXPECT_EQ (utf16_to_code_point (utf16_string ({char16_t{'a'}}), nop_swapper), 97U /*'a'*/);
    EXPECT_EQ (utf16_to_code_point (utf16_string ({char16_t{'a'} << 8}), byte_swapper),
               97U /*'a'*/);
    EXPECT_EQ (utf16_to_code_point (utf16_string ({0x00E0}), byte_swapper), 0xE000U);
    EXPECT_EQ (utf16_to_code_point (utf16_string ({0xD800, 0xDC00}), nop_swapper), 0x010000U);
    EXPECT_EQ (utf16_to_code_point (utf16_string ({0x00D8, 0x00DC}), byte_swapper), 0x010000U);
    EXPECT_EQ (utf16_to_code_point (utf16_string ({0xD800, 0x0000}), nop_swapper),
               replacement_char_code_point);
    EXPECT_EQ (utf16_to_code_point (utf16_string ({0xD800, 0xDBFF}), nop_swapper),
               replacement_char_code_point);
    EXPECT_EQ (utf16_to_code_point (utf16_string ({0xDFFF}), nop_swapper), 0xDFFFU);
}